

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<asd::Header<asd::version<2ul>>&,std::vector<signed_char,std::allocator<signed_char>>const&>
::load_impl_sequence<0ul,1ul>
          (argument_loader<asd::Header<asd::version<2ul>>&,std::vector<signed_char,std::allocator<signed_char>>const&>
           *this,long call)

{
  bool bVar1;
  type_caster_generic *this_00;
  reference pvVar2;
  __tuple_element_t<1UL,_tuple<type_caster<Header<version<2>_>,_void>,_type_caster<vector<signed_char,_allocator<signed_char>_>,_void>_>_>
  *this_01;
  byte local_51;
  reference local_50;
  handle local_40;
  reference local_38;
  handle local_28;
  long local_20;
  function_call *call_local;
  argument_loader<asd::Header<asd::version<2UL>_>_&,_const_std::vector<signed_char,_std::allocator<signed_char>_>_&>
  *this_local;
  
  local_20 = call;
  call_local = (function_call *)this;
  this_00 = (type_caster_generic *)
            std::
            get<0ul,pybind11::detail::type_caster<asd::Header<asd::version<2ul>>,void>,pybind11::detail::type_caster<std::vector<signed_char,std::allocator<signed_char>>,void>>
                      ((tuple<pybind11::detail::type_caster<asd::Header<asd::version<2UL>_>,_void>,_pybind11::detail::type_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_20 + 8),
                      0);
  local_28.m_ptr = pvVar2->m_ptr;
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  bVar1 = type_caster_generic::load(this_00,local_28,bVar1);
  local_51 = 1;
  if (bVar1) {
    this_01 = std::
              get<1ul,pybind11::detail::type_caster<asd::Header<asd::version<2ul>>,void>,pybind11::detail::type_caster<std::vector<signed_char,std::allocator<signed_char>>,void>>
                        ((tuple<pybind11::detail::type_caster<asd::Header<asd::version<2UL>_>,_void>,_pybind11::detail::type_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_void>_>
                          *)this);
    pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_20 + 8),1);
    local_40.m_ptr = pvVar2->m_ptr;
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),1);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
    bVar1 = list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char>::load
                      (&this_01->
                        super_list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char>
                       ,local_40,bVar1);
    local_51 = bVar1 ^ 0xff;
  }
  return (local_51 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is]))) {
            return false;
        }
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...}) {
            if (!r) {
                return false;
            }
        }
#endif
        return true;
    }